

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O2

int8_t msocket_send_to(msocket_t *self,char *addr,uint16_t port,void *msgData,uint32_t msgLen)

{
  socklen_t __addr_len;
  int8_t iVar1;
  int *piVar2;
  ssize_t sVar3;
  int __fd;
  undefined1 local_34 [12];
  ulong uStack_28;
  undefined8 local_20;
  
  if ((self == (msocket_t *)0x0) || ((self->socketMode & 1) == 0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  else {
    local_34._2_2_ = port << 8 | port >> 8;
    if (self->addressFamily == '\n') {
      local_20 = 0;
      local_34[4] = '\0';
      local_34[5] = '\0';
      local_34[6] = '\0';
      local_34[7] = '\0';
      local_34[8] = '\0';
      local_34[9] = '\0';
      local_34[10] = '\0';
      local_34[0xb] = '\0';
      uStack_28 = 0;
      local_34._0_2_ = 10;
      inet_pton(10,addr,local_34 + 8);
      __fd = self->udpsockfd;
      __addr_len = 0x1c;
    }
    else {
      uStack_28 = uStack_28 & 0xffffffff00000000;
      local_34[4] = '\0';
      local_34[5] = '\0';
      local_34[6] = '\0';
      local_34[7] = '\0';
      local_34[8] = '\0';
      local_34[9] = '\0';
      local_34[10] = '\0';
      local_34[0xb] = '\0';
      local_34._0_2_ = 2;
      inet_pton(2,addr,local_34 + 4);
      __fd = self->udpsockfd;
      __addr_len = 0x10;
    }
    sVar3 = sendto(__fd,msgData,(ulong)msgLen,0,(sockaddr *)local_34,__addr_len);
    iVar1 = -1;
    if (-1 < (int)sVar3) {
      pthread_mutex_lock((pthread_mutex_t *)&self->mutex);
      self->inactivityMs = 0;
      self->inactivityCallMs = 1000;
      pthread_mutex_unlock((pthread_mutex_t *)&self->mutex);
      iVar1 = '\0';
    }
  }
  return iVar1;
}

Assistant:

int8_t msocket_send_to(msocket_t *self, const char *addr,uint16_t port,const void *msgData,uint32_t msgLen){
   if( (self != 0) && ( (self->socketMode & MSOCKET_MODE_UDP) != 0)){
      struct sockaddr_in saddr;
      struct sockaddr_in6 saddr6;
      int rc;
      if(self->addressFamily == AF_INET6){
         memset(&saddr6, 0,sizeof(saddr6));
         saddr6.sin6_family = AF_INET6;
         saddr6.sin6_port = htons((uint16_t)port);
         inet_pton(AF_INET6, addr, &(saddr6.sin6_addr));
         rc = sendto(self->udpsockfd,msgData,msgLen,0,(struct sockaddr *)&saddr6,sizeof(saddr6));
      }
      else{
         memset(&saddr, 0,sizeof(saddr));
         saddr.sin_family = AF_INET;
         saddr.sin_port = htons((uint16_t)port);
         inet_pton(AF_INET, addr, &(saddr.sin_addr));
         rc = sendto(self->udpsockfd,msgData,msgLen,0,(struct sockaddr *)&saddr,sizeof(saddr));
      }
      if(rc < 0){
         return -1;
      }
      MUTEX_LOCK(self->mutex);
      msocket_timeoutReset(self);
      MUTEX_UNLOCK(self->mutex);
      return 0;
   }
   errno = EINVAL;
   return -1;
}